

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O3

void __thiscall
PathTracer::Reset(PathTracer *this,shared_ptr<myvk::CommandPool> *command_pool,
                 shared_ptr<myvk::Queue> *shared_queue)

{
  Camera *this_00;
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  initializer_list<std::shared_ptr<myvk::Queue>_> __l;
  undefined8 uStack_60;
  shared_ptr<myvk::Queue> local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> local_38;
  
  this_00 = (this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uStack_60._4_4_ = this_00->m_aspect_ratio;
  this_00->m_aspect_ratio = (float)this->m_width / (float)this->m_height;
  Camera::UpdateFrameUniformBuffer(this_00,3);
  ((this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_aspect_ratio = uStack_60._4_4_;
  Sobol::Reset(&this->m_sobol,command_pool,this->m_bounce * 2 + 2);
  iVar2 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar1 = (command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->m_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->m_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_58.super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (shared_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40 = (shared_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = &local_58;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            (&local_38,__l,(allocator_type *)((long)&uStack_60 + 3));
  create_target_images(this,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var,iVar2),&local_38);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_38);
  lVar3 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar3) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar3));
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  clear_target_images(this,command_pool);
  myvk::DescriptorSet::UpdateStorageImage
            ((this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_color_image_view,0,0);
  myvk::DescriptorSet::UpdateStorageImage
            ((this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_albedo_image_view,1,0);
  myvk::DescriptorSet::UpdateStorageImage
            ((this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_normal_image_view,2,0);
  return;
}

Assistant:

void PathTracer::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool,
                       const std::shared_ptr<myvk::Queue> &shared_queue) {
	{
		float tmp = m_camera_ptr->m_aspect_ratio;
		m_camera_ptr->m_aspect_ratio = m_width / float(m_height);
		m_camera_ptr->UpdateFrameUniformBuffer(kFrameCount);
		m_camera_ptr->m_aspect_ratio = tmp;
	}
	m_sobol.Reset(command_pool, (m_bounce + 1) * 2);
	create_target_images(command_pool->GetDevicePtr(), {command_pool->GetQueuePtr(), shared_queue});
	clear_target_images(command_pool);
	m_target_descriptor_set->UpdateStorageImage(m_color_image_view, 0);
	m_target_descriptor_set->UpdateStorageImage(m_albedo_image_view, 1);
	m_target_descriptor_set->UpdateStorageImage(m_normal_image_view, 2);
}